

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simMan.c
# Opt level: O1

void Sim_ManPrintStats(Sim_Man_t *p)

{
  uint uVar1;
  int level;
  
  uVar1 = Sim_UtilCountSuppSizes(p,0);
  printf("Total func supps   = %8d.\n",(ulong)uVar1);
  uVar1 = Sim_UtilCountSuppSizes(p,1);
  printf("Total struct supps = %8d.\n",(ulong)uVar1);
  printf("Sat runs SAT       = %8d.\n",(ulong)(uint)p->nSatRunsSat);
  level = 0xa6023d;
  printf("Sat runs UNSAT     = %8d.\n",(ulong)(uint)p->nSatRunsUnsat);
  Abc_Print(level,"%s =","Simulation  ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeSim / 1000000.0);
  Abc_Print(level,"%s =","Traversal   ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeTrav / 1000000.0);
  Abc_Print(level,"%s =","Fraiging    ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeFraig / 1000000.0);
  Abc_Print(level,"%s =","SAT         ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeSat / 1000000.0);
  Abc_Print(level,"%s =","TOTAL       ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeTotal / 1000000.0);
  return;
}

Assistant:

void Sim_ManPrintStats( Sim_Man_t * p )
{
//    printf( "Inputs = %5d. Outputs = %5d. Sim words = %5d.\n", 
//        Abc_NtkCiNum(p->pNtk), Abc_NtkCoNum(p->pNtk), p->nSimWords );
    printf( "Total func supps   = %8d.\n", Sim_UtilCountSuppSizes(p, 0) );
    printf( "Total struct supps = %8d.\n", Sim_UtilCountSuppSizes(p, 1) );
    printf( "Sat runs SAT       = %8d.\n", p->nSatRunsSat );
    printf( "Sat runs UNSAT     = %8d.\n", p->nSatRunsUnsat );
    ABC_PRT( "Simulation  ", p->timeSim );
    ABC_PRT( "Traversal   ", p->timeTrav );
    ABC_PRT( "Fraiging    ", p->timeFraig );
    ABC_PRT( "SAT         ", p->timeSat );
    ABC_PRT( "TOTAL       ", p->timeTotal );
}